

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5WriteFlushBtree(Fts5Index *p,Fts5SegWriter *pWriter)

{
  int iVar1;
  u8 *local_30;
  char *z;
  int bFlag;
  Fts5SegWriter *pWriter_local;
  Fts5Index *p_local;
  
  if (pWriter->iBtPage != 0) {
    iVar1 = fts5WriteFlushDlidx(p,pWriter);
    if (p->rc == 0) {
      if ((pWriter->btterm).n < 1) {
        local_30 = "";
      }
      else {
        local_30 = (pWriter->btterm).p;
      }
      sqlite3_bind_blob(p->pIdxWriter,2,local_30,(pWriter->btterm).n,(_func_void_void_ptr *)0x0);
      sqlite3_bind_int64(p->pIdxWriter,3,(long)iVar1 + (long)pWriter->iBtPage * 2);
      sqlite3_step(p->pIdxWriter);
      iVar1 = sqlite3_reset(p->pIdxWriter);
      p->rc = iVar1;
      sqlite3_bind_null(p->pIdxWriter,2);
    }
    pWriter->iBtPage = 0;
  }
  return;
}

Assistant:

static void fts5WriteFlushBtree(Fts5Index *p, Fts5SegWriter *pWriter){
  int bFlag;

  assert( pWriter->iBtPage || pWriter->nEmpty==0 );
  if( pWriter->iBtPage==0 ) return;
  bFlag = fts5WriteFlushDlidx(p, pWriter);

  if( p->rc==SQLITE_OK ){
    const char *z = (pWriter->btterm.n>0?(const char*)pWriter->btterm.p:"");
    /* The following was already done in fts5WriteInit(): */
    /* sqlite3_bind_int(p->pIdxWriter, 1, pWriter->iSegid); */
    sqlite3_bind_blob(p->pIdxWriter, 2, z, pWriter->btterm.n, SQLITE_STATIC);
    sqlite3_bind_int64(p->pIdxWriter, 3, bFlag + ((i64)pWriter->iBtPage<<1));
    sqlite3_step(p->pIdxWriter);
    p->rc = sqlite3_reset(p->pIdxWriter);
    sqlite3_bind_null(p->pIdxWriter, 2);
  }
  pWriter->iBtPage = 0;
}